

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layers.cpp
# Opt level: O2

void __thiscall CLayers::InitTilemapSkip(CLayers *this)

{
  int iVar1;
  int iVar2;
  CMapItemGroup *pCVar3;
  CMapItemLayer *pCVar4;
  undefined4 extraout_var;
  int iVar5;
  int iVar6;
  int l;
  int iVar7;
  int Index;
  int iVar8;
  long lVar9;
  ulong uVar10;
  CMapItemLayerTilemap *pTilemap;
  
  for (Index = 0; Index < this->m_GroupsNum; Index = Index + 1) {
    pCVar3 = GetGroup(this,Index);
    for (iVar7 = 0; iVar7 < (pCVar3->super_CMapItemGroup_v1).m_NumLayers; iVar7 = iVar7 + 1) {
      pCVar4 = GetLayer(this,(pCVar3->super_CMapItemGroup_v1).m_StartLayer + iVar7);
      if (pCVar4->m_Type == 2) {
        iVar2 = (*(this->m_pMap->super_IInterface)._vptr_IInterface[2])
                          (this->m_pMap,(ulong)(uint)pCVar4[4].m_Flags);
        iVar6 = 0;
        iVar5 = pCVar4[1].m_Flags;
        if (pCVar4[1].m_Flags < 1) {
          iVar5 = iVar6;
        }
        for (; iVar6 != iVar5; iVar6 = iVar6 + 1) {
          iVar1 = pCVar4[1].m_Type;
          for (iVar8 = 1; iVar8 < iVar1; iVar8 = iVar8 + (int)uVar10) {
            lVar9 = (long)(iVar1 * iVar6 + iVar8);
            for (uVar10 = 1;
                ((uVar10 < 0xff && ((long)((long)iVar8 + uVar10) < (long)iVar1)) &&
                (*(char *)(CONCAT44(extraout_var,iVar2) + lVar9 * 4 + uVar10 * 4) == '\0'));
                uVar10 = uVar10 + 1) {
            }
            *(char *)(CONCAT44(extraout_var,iVar2) + 2 + lVar9 * 4) = (char)uVar10 + -1;
          }
        }
      }
    }
  }
  return;
}

Assistant:

void CLayers::InitTilemapSkip()
{
	for(int g = 0; g < NumGroups(); g++)
	{
		CMapItemGroup *pGroup = GetGroup(g);
		for(int l = 0; l < pGroup->m_NumLayers; l++)
		{
			CMapItemLayer *pLayer = GetLayer(pGroup->m_StartLayer+l);
			if(pLayer->m_Type == LAYERTYPE_TILES)
			{
				CMapItemLayerTilemap *pTilemap = (CMapItemLayerTilemap *)pLayer;
				CTile *pTiles = (CTile *)Map()->GetData(pTilemap->m_Data);
				for(int y = 0; y < pTilemap->m_Height; y++)
				{
					for(int x = 1; x < pTilemap->m_Width;)
					{
						int SkippedX;
						for(SkippedX = 1; x+SkippedX < pTilemap->m_Width && SkippedX < 255; SkippedX++)
						{
							if(pTiles[y*pTilemap->m_Width+x+SkippedX].m_Index)
								break;
						}

						pTiles[y*pTilemap->m_Width+x].m_Skip = SkippedX-1;
						x += SkippedX;
					}
				}
			}
		}
	}
}